

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O2

bool __thiscall
Omega_h::CmdLineFlag::parse_impl(CmdLineFlag *this,int *p_argc,char **argv,int i,bool should_print)

{
  pointer puVar1;
  bool bVar2;
  ostream *poVar3;
  iterator __begin1;
  pointer puVar4;
  
  shift(p_argc,argv,i);
  puVar4 = (this->args_).
           super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->args_).
           super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (*p_argc - i < (int)((ulong)((long)puVar1 - (long)puVar4) >> 3)) {
    if (should_print) {
      poVar3 = std::operator<<((ostream *)&std::cout,"flag ");
      poVar3 = std::operator<<(poVar3,(string *)&(this->super_CmdLineItem).name_);
      poVar3 = std::operator<<(poVar3," takes ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," arguments\n");
    }
LAB_0024d4e6:
    bVar2 = false;
  }
  else {
    for (; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      bVar2 = CmdLineItem::parse((puVar4->_M_t).
                                 super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
                                 .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>._M_head_impl,
                                 p_argc,argv,i,should_print);
      if (!bVar2) {
        if (should_print) {
          poVar3 = std::operator<<((ostream *)&std::cout,"could not parse argument <");
          poVar3 = std::operator<<(poVar3,(string *)
                                          &((puVar4->_M_t).
                                            super___uniq_ptr_impl<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_Omega_h::CmdLineItem_*,_std::default_delete<Omega_h::CmdLineItem>_>
                                            .super__Head_base<0UL,_Omega_h::CmdLineItem_*,_false>.
                                           _M_head_impl)->name_);
          poVar3 = std::operator<<(poVar3,"> of flag ");
          poVar3 = std::operator<<(poVar3,(string *)&(this->super_CmdLineItem).name_);
          std::operator<<(poVar3,'\n');
        }
        goto LAB_0024d4e6;
      }
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool CmdLineFlag::parse_impl(
    int* p_argc, char** argv, int i, bool should_print) {
  shift(p_argc, argv, i);
  if (((*p_argc) - i) < int(args_.size())) {
    if (should_print) {
      std::cout << "flag " << name() << " takes " << args_.size()
                << " arguments\n";
    }
    return false;
  }
  for (auto const& the_arg : args_) {
    if (!the_arg->parse(p_argc, argv, i, should_print)) {
      if (should_print) {
        std::cout << "could not parse argument <" << the_arg->name()
                  << "> of flag " << name() << '\n';
      }
      return false;
    }
  }
  return true;
}